

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<capnp::(anonymous_namespace)::CapnpcCppMain::FieldText>::dispose
          (ArrayBuilder<capnp::(anonymous_namespace)::CapnpcCppMain::FieldText> *this)

{
  FieldText *firstElement;
  RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::FieldText> *pRVar1;
  FieldText *pFVar2;
  FieldText *endCopy;
  FieldText *posCopy;
  FieldText *ptrCopy;
  ArrayBuilder<capnp::(anonymous_namespace)::CapnpcCppMain::FieldText> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pFVar2 = this->endPtr;
  if (firstElement != (FieldText *)0x0) {
    this->ptr = (FieldText *)0x0;
    this->pos = (RemoveConst<capnp::(anonymous_namespace)::CapnpcCppMain::FieldText> *)0x0;
    this->endPtr = (FieldText *)0x0;
    ArrayDisposer::dispose<capnp::(anonymous_namespace)::CapnpcCppMain::FieldText>
              (this->disposer,firstElement,((long)pRVar1 - (long)firstElement) / 0xe0,
               ((long)pFVar2 - (long)firstElement) / 0xe0);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }